

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O0

_Bool chck_pool(chck_pool *pool,size_t grow,size_t capacity,size_t member_size)

{
  _Bool _Var1;
  _Bool local_c1;
  undefined1 local_c0 [144];
  size_t local_30;
  size_t member_size_local;
  size_t capacity_local;
  size_t grow_local;
  chck_pool *pool_local;
  
  local_30 = member_size;
  member_size_local = capacity;
  capacity_local = grow;
  grow_local = (size_t)pool;
  if ((pool != (chck_pool *)0x0) && (member_size != 0)) {
    if (member_size == 0) {
      pool_local._7_1_ = false;
    }
    else {
      memset(local_c0,0,0x90);
      memcpy(pool,local_c0,0x90);
      _Var1 = pool_buffer((chck_pool_buffer *)grow_local,capacity_local,member_size_local,local_30);
      local_c1 = false;
      if (_Var1) {
        _Var1 = pool_buffer((chck_pool_buffer *)(grow_local + 0x30),capacity_local,member_size_local
                            ,1);
        local_c1 = false;
        if (_Var1) {
          local_c1 = pool_buffer((chck_pool_buffer *)(grow_local + 0x60),capacity_local,0,8);
        }
      }
      pool_local._7_1_ = local_c1;
    }
    return pool_local._7_1_;
  }
  __assert_fail("pool && member_size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0x11c,"_Bool chck_pool(struct chck_pool *, size_t, size_t, size_t)");
}

Assistant:

bool
chck_pool(struct chck_pool *pool, size_t grow, size_t capacity, size_t member_size)
{
   assert(pool && member_size > 0);

   if (unlikely(!member_size))
      return false;

   *pool = (struct chck_pool){0};
   return (pool_buffer(&pool->items, grow, capacity, member_size) &&
           pool_buffer(&pool->map, grow, capacity, sizeof(bool)) &&
           pool_buffer(&pool->removed, grow, 0, sizeof(size_t)));
}